

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseCharDataComplex(xmlParserCtxtPtr ctxt,int cdata)

{
  int iVar1;
  bool local_162;
  int local_158;
  int local_154;
  int count;
  int l;
  int cur;
  int nbchar;
  xmlChar buf [305];
  int cdata_local;
  xmlParserCtxtPtr ctxt_local;
  
  l = 0;
  local_158 = 0;
  buf._300_4_ = cdata;
  unique0x100007a8 = ctxt;
  if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
    xmlSHRINK(ctxt);
  }
  if ((stack0xfffffffffffffff0->progressive == 0) &&
     ((long)stack0xfffffffffffffff0->input->end - (long)stack0xfffffffffffffff0->input->cur < 0xfa))
  {
    xmlGROW(stack0xfffffffffffffff0);
  }
  count = xmlCurrentChar(stack0xfffffffffffffff0,&local_154);
  while( true ) {
    if ((((stack0xfffffffffffffff0->mlType == XML_TYPE_XML) && (count != 0x3c)) ||
        (((local_162 = false, stack0xfffffffffffffff0->mlType == XML_TYPE_SML &&
          ((count != 0x7d || (local_162 = false, stack0xfffffffffffffff0->quoted != 0)))) &&
         ((count != 0x22 || (local_162 = false, stack0xfffffffffffffff0->quoted == 0)))))) &&
       (local_162 = false, count != 0x26)) {
      if (count < 0x100) {
        if (((count < 9) || (local_162 = true, 10 < count)) && (local_162 = true, count != 0xd)) {
          local_162 = 0x1f < count;
        }
      }
      else if (((count < 0x100) || (local_162 = true, 0xd7ff < count)) &&
              ((count < 0xe000 || (local_162 = true, 0xfffd < count)))) {
        local_162 = 0xffff < count && count < 0x110000;
      }
    }
    if ((!local_162) ||
       (((stack0xfffffffffffffff0->mlType == XML_TYPE_SML && (stack0xfffffffffffffff0->quoted == 0))
        && (((stack0xfffffffffffffff0->curly == 0 && ((count == 10 || (count == 0x3b)))) ||
            ((stack0xfffffffffffffff0->curly != 0 &&
             ((count != 0x20 && (((count < 9 || (10 < count)) && (count != 0xd)))))))))))) break;
    if ((((count == 0x5d) && (stack0xfffffffffffffff0->input->cur[1] == ']')) &&
        (stack0xfffffffffffffff0->input->cur[2] == '>')) &&
       ((stack0xfffffffffffffff0->mlType != XML_TYPE_SML || (stack0xfffffffffffffff0->quoted == 0)))
       ) {
      if (buf._300_4_ != 0) break;
      xmlFatalErr(stack0xfffffffffffffff0,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
    }
    if (((stack0xfffffffffffffff0->mlType == XML_TYPE_SML) && (stack0xfffffffffffffff0->quoted != 0)
        ) && (count == 0x5c)) {
      local_158 = local_158 + 1;
      if (*stack0xfffffffffffffff0->input->cur == '\n') {
        stack0xfffffffffffffff0->input->line = stack0xfffffffffffffff0->input->line + 1;
        stack0xfffffffffffffff0->input->col = 1;
      }
      else {
        stack0xfffffffffffffff0->input->col = stack0xfffffffffffffff0->input->col + 1;
      }
      stack0xfffffffffffffff0->input->cur = stack0xfffffffffffffff0->input->cur + local_154;
      count = xmlCurrentChar(stack0xfffffffffffffff0,&local_154);
    }
    if (local_154 == 1) {
      *(char *)((long)&cur + (long)l) = (char)count;
      l = l + 1;
    }
    else {
      iVar1 = xmlCopyCharMultiByte((xmlChar *)((long)&cur + (long)l),count);
      l = iVar1 + l;
    }
    if (299 < l) {
      *(undefined1 *)((long)&cur + (long)l) = 0;
      if ((stack0xfffffffffffffff0->sax != (_xmlSAXHandler *)0x0) &&
         (stack0xfffffffffffffff0->disableSAX == 0)) {
        iVar1 = areBlanks(stack0xfffffffffffffff0,(xmlChar *)&cur,l,0);
        if (iVar1 == 0) {
          if (stack0xfffffffffffffff0->sax->characters != (charactersSAXFunc)0x0) {
            (*stack0xfffffffffffffff0->sax->characters)
                      (stack0xfffffffffffffff0->userData,(xmlChar *)&cur,l);
          }
          if ((stack0xfffffffffffffff0->sax->characters !=
               stack0xfffffffffffffff0->sax->ignorableWhitespace) &&
             (*stack0xfffffffffffffff0->space == -1)) {
            *stack0xfffffffffffffff0->space = -2;
          }
        }
        else if (stack0xfffffffffffffff0->sax->ignorableWhitespace !=
                 (ignorableWhitespaceSAXFunc)0x0) {
          (*stack0xfffffffffffffff0->sax->ignorableWhitespace)
                    (stack0xfffffffffffffff0->userData,(xmlChar *)&cur,l);
        }
      }
      l = 0;
      if (stack0xfffffffffffffff0->instate != XML_PARSER_CONTENT) {
        return;
      }
    }
    local_158 = local_158 + 1;
    if (0x32 < local_158) {
      if ((stack0xfffffffffffffff0->progressive == 0) &&
         ((long)stack0xfffffffffffffff0->input->end - (long)stack0xfffffffffffffff0->input->cur <
          0xfa)) {
        xmlGROW(stack0xfffffffffffffff0);
      }
      local_158 = 0;
      if (stack0xfffffffffffffff0->instate == XML_PARSER_EOF) {
        return;
      }
    }
    if (*stack0xfffffffffffffff0->input->cur == '\n') {
      stack0xfffffffffffffff0->input->line = stack0xfffffffffffffff0->input->line + 1;
      stack0xfffffffffffffff0->input->col = 1;
    }
    else {
      stack0xfffffffffffffff0->input->col = stack0xfffffffffffffff0->input->col + 1;
    }
    stack0xfffffffffffffff0->input->cur = stack0xfffffffffffffff0->input->cur + local_154;
    count = xmlCurrentChar(stack0xfffffffffffffff0,&local_154);
  }
  if (((l != 0) &&
      (*(undefined1 *)((long)&cur + (long)l) = 0,
      stack0xfffffffffffffff0->sax != (_xmlSAXHandler *)0x0)) &&
     (stack0xfffffffffffffff0->disableSAX == 0)) {
    iVar1 = areBlanks(stack0xfffffffffffffff0,(xmlChar *)&cur,l,0);
    if (iVar1 == 0) {
      if (stack0xfffffffffffffff0->sax->characters != (charactersSAXFunc)0x0) {
        (*stack0xfffffffffffffff0->sax->characters)
                  (stack0xfffffffffffffff0->userData,(xmlChar *)&cur,l);
      }
      if ((stack0xfffffffffffffff0->sax->characters !=
           stack0xfffffffffffffff0->sax->ignorableWhitespace) &&
         (*stack0xfffffffffffffff0->space == -1)) {
        *stack0xfffffffffffffff0->space = -2;
      }
    }
    else if (stack0xfffffffffffffff0->sax->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) {
      (*stack0xfffffffffffffff0->sax->ignorableWhitespace)
                (stack0xfffffffffffffff0->userData,(xmlChar *)&cur,l);
    }
  }
  if (count != 0) {
    if (count < 0x100) {
      if ((8 < count) && (count < 0xb)) {
        return;
      }
      if (count == 0xd) {
        return;
      }
      if (0x1f < count) {
        return;
      }
    }
    else {
      if ((0xff < count) && (count < 0xd800)) {
        return;
      }
      if ((0xdfff < count) && (count < 0xfffe)) {
        return;
      }
      if ((0xffff < count) && (count < 0x110000)) {
        return;
      }
    }
    xmlFatalErrMsgInt(stack0xfffffffffffffff0,XML_ERR_INVALID_CHAR,"PCDATA invalid Char value %d\n",
                      count);
    if (*stack0xfffffffffffffff0->input->cur == '\n') {
      stack0xfffffffffffffff0->input->line = stack0xfffffffffffffff0->input->line + 1;
      stack0xfffffffffffffff0->input->col = 1;
    }
    else {
      stack0xfffffffffffffff0->input->col = stack0xfffffffffffffff0->input->col + 1;
    }
    stack0xfffffffffffffff0->input->cur = stack0xfffffffffffffff0->input->cur + local_154;
  }
  return;
}

Assistant:

static void
xmlParseCharDataComplex(xmlParserCtxtPtr ctxt, int cdata) {
    xmlChar buf[XML_PARSER_BIG_BUFFER_SIZE + 5];
    int nbchar = 0;
    int cur, l;
    int count = 0;

    DEBUG_ENTER(("xmlParseCharDataComplex(%s, %d);\n", dbgCtxt(ctxt), cdata));

    SHRINK;
    GROW;
    cur = CUR_CHAR(l);
    DEBUG_CODE(
    if (ISSML)
        DEBUG_PRINTF(("curly = %d; quoted = %d;\n", ctxt->curly, ctxt->quoted));
    )
    while ((   (ISXML && (cur != '<')) /* checked */
	    || (ISSML && ((cur != '}') ||  ctxt->quoted) &&
	    	         ((cur != '"') || !ctxt->quoted))
	    ) &&
	   (cur != '&') &&
	   (IS_CHAR(cur))) /* test also done in xmlCurrentChar() */ {
	/* More complex termination criteria, that would have been confusing in the while loop */
	if (ISSML && (!ctxt->quoted)) {
	    if ((!ctxt->curly) && ((cur == '\n') || (cur == ';'))) break; /* End of element */
	    if (( ctxt->curly) && (!IS_BLANK_CH(cur))) break; /* End of initial spaces */
	}
	if ((cur == ']') && (NXT(1) == ']') &&
	    (NXT(2) == '>') && ((ctxt->mlType != XML_TYPE_SML) || !ctxt->quoted)) {
	    if (cdata) break;
	    else {
		xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
	    }
	}
	XDEBUG_PRINTF(("cur = '%s'\n", dbgChar(cur)));
	if (ISSML && ctxt->quoted && (cur == '\\')) {
	    count++;
	    NEXTL(l);
	    cur = CUR_CHAR(l);
	  XDEBUG_PRINTF(("cur = '%s'\n", dbgChar(cur)));
	}
	COPY_BUF(l,buf,nbchar,cur);
	if (nbchar >= XML_PARSER_BIG_BUFFER_SIZE) {
	    buf[nbchar] = 0;

	    /*
	     * OK the segment is to be consumed as chars.
	     */
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX)) {
		if (areBlanks(ctxt, buf, nbchar, 0)) {
		    if (ctxt->sax->ignorableWhitespace != NULL)
			ctxt->sax->ignorableWhitespace(ctxt->userData,
						       buf, nbchar);
		} else {
		    if (ctxt->sax->characters != NULL)
			ctxt->sax->characters(ctxt->userData, buf, nbchar);
		    if ((ctxt->sax->characters !=
			 ctxt->sax->ignorableWhitespace) &&
			(*ctxt->space == -1))
			*ctxt->space = -2;
		}
	    }
	    nbchar = 0;
	    /* something really bad happened in the SAX callback */
	    if (ctxt->instate != XML_PARSER_CONTENT)
		RETURN();
	}
	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
	    if (ctxt->instate == XML_PARSER_EOF)
		RETURN();
	}
	NEXTL(l);
	cur = CUR_CHAR(l);
    }
    if (nbchar != 0) {
        buf[nbchar] = 0;
        /* DEBUG_PRINTF(("Found text \"%s\"\n", buf)); */
	/*
	 * OK the segment is to be consumed as chars.
	 */
	if ((ctxt->sax != NULL) && (!ctxt->disableSAX)) {
	    if (areBlanks(ctxt, buf, nbchar, 0)) {
		if (ctxt->sax->ignorableWhitespace != NULL)
		    ctxt->sax->ignorableWhitespace(ctxt->userData, buf, nbchar);
	    } else {
		if (ctxt->sax->characters != NULL)
		    ctxt->sax->characters(ctxt->userData, buf, nbchar);
		if ((ctxt->sax->characters != ctxt->sax->ignorableWhitespace) &&
		    (*ctxt->space == -1))
		    *ctxt->space = -2;
	    }
	}
    } else {
    	DEBUG_CODE(
    	    buf[0] = 0;
	)
    }
    if ((cur != 0) && (!IS_CHAR(cur))) {
	/* Generate the error and skip the offending character */
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "PCDATA invalid Char value %d\n",
	                  cur);
	NEXTL(l);
    }
    RETURN_COMMENT(("text = %s;\n", dbgStr(buf)));
}